

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign
          (CImgDisplay *this,uint dimw,uint dimh,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  void *__s;
  long lVar1;
  CImgDisplay *pCVar2;
  
  if (dimw != 0 && dimh != 0) {
    _assign(this,dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
    this->_min = 0.0;
    this->_max = 0.0;
    __s = this->_data;
    if (cimg::X11_attr()::val == '\0') {
      assign();
    }
    lVar1 = 1;
    if (cimg::X11_attr::val.nb_bits != 8) {
      if (cimg::X11_attr()::val == '\0') {
        assign();
      }
      lVar1 = (ulong)(cimg::X11_attr::val.nb_bits != 0x10) * 2 + 2;
    }
    memset(__s,0,(ulong)this->_height * (ulong)this->_width * lVar1);
    pCVar2 = paint(this,true);
    return pCVar2;
  }
  pCVar2 = assign(this);
  return pCVar2;
}

Assistant:

CImgDisplay& assign(const unsigned int dimw, const unsigned int dimh, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!dimw || !dimh) return assign();
      _assign(dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
      _min = _max = 0;
      std::memset(_data,0,(cimg::X11_attr().nb_bits==8?sizeof(unsigned char):
                          (cimg::X11_attr().nb_bits==16?sizeof(unsigned short):sizeof(unsigned int)))*_width*_height);
      return paint();
    }